

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H16_merge_sort.c
# Opt level: O0

int main(void)

{
  uint local_78 [2];
  int arrB [10];
  int local_44;
  int i;
  int local_38 [2];
  int arrA [10];
  int n;
  
  arrA[9] = 0;
  arrA[8] = 10;
  memcpy(local_38,&DAT_00102010,0x28);
  sort(local_38,0,9,(int *)local_78);
  for (local_44 = 0; local_44 < 10; local_44 = local_44 + 1) {
    printf("%d ",(ulong)(uint)arrB[(long)local_44 + -2]);
  }
  return arrA[9];
}

Assistant:

int main() {
  const int n = 10;
  int arrA[n] = {5, 7, 3, 4, 8, 1, 2, 9, 0, 6};
  int arrB[n];
  sort(arrA, 0, n - 1, arrB);

  for (int i = 0; i < n; i++) {
    printf("%d ", arrB[i]);
  }
}